

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

char * otense(obj *otmp,char *verb)

{
  int iVar1;
  char *pcVar2;
  
  if ((otmp->quan < 2) && (otmp->oartifact != '\x1d')) {
    pcVar2 = vtense((char *)0x0,verb);
    return pcVar2;
  }
  iVar1 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar1) >> 1) - iVar1) * -0xc + 1;
  pcVar2 = strcpy(nextobuf_bufs + (long)nextobuf_bufidx * 0x100,verb);
  return pcVar2;
}

Assistant:

char *otense(const struct obj *otmp, const char *verb)
{
	char *buf;

	/*
	 * verb is given in plural (without trailing s).  Return as input
	 * if the result of xname(otmp) would be plural.  Don't bother
	 * recomputing xname(otmp) at this time.
	 */
	if (!is_plural(otmp))
	    return vtense(NULL, verb);

	buf = nextobuf();
	strcpy(buf, verb);
	return buf;
}